

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_set_gamma_fixed(png_structrp png_ptr,png_fixed_point scrn_gamma,png_fixed_point file_gamma)

{
  int iVar1;
  png_fixed_point pVar2;
  png_fixed_point pVar3;
  png_fixed_point file_gamma_local;
  png_fixed_point scrn_gamma_local;
  png_structrp png_ptr_local;
  
  iVar1 = png_rtran_ok(png_ptr,0);
  if (iVar1 != 0) {
    pVar2 = translate_gamma_flags(png_ptr,scrn_gamma,1);
    pVar3 = translate_gamma_flags(png_ptr,file_gamma,0);
    if (pVar3 < 1) {
      png_error(png_ptr,"invalid file gamma in png_set_gamma");
    }
    if (pVar2 < 1) {
      png_error(png_ptr,"invalid screen gamma in png_set_gamma");
    }
    (png_ptr->colorspace).gamma = pVar3;
    (png_ptr->colorspace).flags = (png_ptr->colorspace).flags | 1;
    png_ptr->screen_gamma = pVar2;
  }
  return;
}

Assistant:

void PNGFAPI
png_set_gamma_fixed(png_structrp png_ptr, png_fixed_point scrn_gamma,
    png_fixed_point file_gamma)
{
   png_debug(1, "in png_set_gamma_fixed");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   /* New in libpng-1.5.4 - reserve particular negative values as flags. */
   scrn_gamma = translate_gamma_flags(png_ptr, scrn_gamma, 1/*screen*/);
   file_gamma = translate_gamma_flags(png_ptr, file_gamma, 0/*file*/);

   /* Checking the gamma values for being >0 was added in 1.5.4 along with the
    * premultiplied alpha support; this actually hides an undocumented feature
    * of the previous implementation which allowed gamma processing to be
    * disabled in background handling.  There is no evidence (so far) that this
    * was being used; however, png_set_background itself accepted and must still
    * accept '0' for the gamma value it takes, because it isn't always used.
    *
    * Since this is an API change (albeit a very minor one that removes an
    * undocumented API feature) the following checks were only enabled in
    * libpng-1.6.0.
    */
   if (file_gamma <= 0)
      png_error(png_ptr, "invalid file gamma in png_set_gamma");

   if (scrn_gamma <= 0)
      png_error(png_ptr, "invalid screen gamma in png_set_gamma");

   /* Set the gamma values unconditionally - this overrides the value in the PNG
    * file if a gAMA chunk was present.  png_set_alpha_mode provides a
    * different, easier, way to default the file gamma.
    */
   png_ptr->colorspace.gamma = file_gamma;
   png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;
   png_ptr->screen_gamma = scrn_gamma;
}